

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O1

void ossl_trace(int direction,int ssl_ver,int content_type,void *buf,size_t len,SSL *ssl,void *userp
               )

{
  Curl_easy *data;
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  ulong uVar5;
  uint uVar6;
  char unknown [32];
  char ssl_buf [1024];
  
  data = (Curl_easy *)**(undefined8 **)((long)userp + 0x220);
  if (data == (Curl_easy *)0x0 || userp == (void *)0x0) {
    return;
  }
  if ((data->set).fdebug == (curl_debug_callback)0x0) {
    return;
  }
  if (1 < (uint)direction) {
    return;
  }
  switch(ssl_ver) {
  case 0x300:
    pcVar2 = "SSLv3";
    break;
  case 0x301:
    pcVar2 = "TLSv1.0";
    break;
  case 0x302:
    pcVar2 = "TLSv1.1";
    break;
  case 0x303:
    pcVar2 = "TLSv1.2";
    break;
  case 0x304:
    pcVar2 = "TLSv1.3";
    break;
  default:
    if (ssl_ver == 0) {
      pcVar2 = (char *)0x0;
    }
    else if (ssl_ver == 2) {
      pcVar2 = "SSLv2";
    }
    else {
      curl_msnprintf(unknown,0x20,"(%x)",(ulong)(uint)ssl_ver);
      pcVar2 = unknown;
    }
  }
  if (content_type == 0x101 || ssl_ver == 0) goto LAB_005dd12a;
  if (content_type == 0 || (ssl_ver & 0xffffff00U) != 0x300) {
    pcVar4 = "";
  }
  else {
    switch(content_type) {
    case 0x14:
      pcVar4 = "TLS change cipher";
      break;
    case 0x15:
      pcVar4 = "TLS alert";
      break;
    case 0x16:
      pcVar4 = "TLS handshake";
      break;
    case 0x17:
      pcVar4 = "TLS app data";
      break;
    default:
      if (content_type == 0x100) {
        pcVar4 = "TLS header";
      }
      else {
        pcVar4 = "TLS Unknown";
      }
    }
  }
  uVar5 = (ulong)(uint)(int)*buf;
  if (content_type == 0x14) {
    pcVar1 = "Change cipher spec";
  }
  else if (content_type == 0x15) {
    uVar6 = (int)*(char *)((long)buf + 1) + *buf * 0x100;
    pcVar1 = SSL_alert_desc_string_long(uVar6);
    uVar5 = (ulong)uVar6;
  }
  else if ((ssl_ver & 0xffffff00U) == 0x300) {
    switch(uVar5 & 0xff) {
    case 0:
      pcVar1 = "Hello request";
      break;
    case 1:
      pcVar1 = "Client hello";
      break;
    case 2:
      pcVar1 = "Server hello";
      break;
    case 3:
    case 6:
    case 7:
    case 9:
    case 10:
    case 0x11:
    case 0x12:
    case 0x13:
    case 0x15:
      goto switchD_005dd074_caseD_3;
    case 4:
      pcVar1 = "Newsession Ticket";
      break;
    case 5:
      pcVar1 = "End of early data";
      break;
    case 8:
      pcVar1 = "Encrypted Extensions";
      break;
    case 0xb:
      pcVar1 = "Certificate";
      break;
    case 0xc:
      pcVar1 = "Server key exchange";
      break;
    case 0xd:
      pcVar1 = "Request CERT";
      break;
    case 0xe:
      pcVar1 = "Server finished";
      break;
    case 0xf:
      pcVar1 = "CERT verify";
      break;
    case 0x10:
      pcVar1 = "Client key exchange";
      break;
    case 0x14:
      pcVar1 = "Finished";
      break;
    case 0x16:
      pcVar1 = "Certificate Status";
      break;
    case 0x17:
      pcVar1 = "Supplemental data";
      break;
    case 0x18:
      pcVar1 = "Key update";
      break;
    default:
      if ((int)(uVar5 & 0xff) != 0x43) goto switchD_005dd074_caseD_3;
      pcVar1 = "Next protocol";
    }
  }
  else {
switchD_005dd074_caseD_3:
    pcVar1 = "Unknown";
  }
  pcVar3 = "OUT";
  if (direction == 0) {
    pcVar3 = "IN";
  }
  uVar6 = curl_msnprintf(ssl_buf,0x400,"%s (%s), %s, %s (%d):\n",pcVar2,pcVar3,pcVar4,pcVar1,uVar5);
  if (uVar6 < 0x400) {
    Curl_debug(data,CURLINFO_TEXT,ssl_buf,(ulong)uVar6);
  }
LAB_005dd12a:
  Curl_debug(data,(direction == 1) + CURLINFO_SSL_DATA_IN,(char *)buf,len);
  return;
}

Assistant:

static void ossl_trace(int direction, int ssl_ver, int content_type,
                       const void *buf, size_t len, SSL *ssl,
                       void *userp)
{
  char unknown[32];
  const char *verstr = NULL;
  struct connectdata *conn = userp;
  struct ssl_connect_data *connssl = &conn->ssl[0];
  struct ssl_backend_data *backend = connssl->backend;
  struct Curl_easy *data = NULL;

  DEBUGASSERT(backend);
  data = backend->logger;

  if(!conn || !data || !data->set.fdebug ||
     (direction != 0 && direction != 1))
    return;

  switch(ssl_ver) {
#ifdef SSL2_VERSION /* removed in recent versions */
  case SSL2_VERSION:
    verstr = "SSLv2";
    break;
#endif
#ifdef SSL3_VERSION
  case SSL3_VERSION:
    verstr = "SSLv3";
    break;
#endif
  case TLS1_VERSION:
    verstr = "TLSv1.0";
    break;
#ifdef TLS1_1_VERSION
  case TLS1_1_VERSION:
    verstr = "TLSv1.1";
    break;
#endif
#ifdef TLS1_2_VERSION
  case TLS1_2_VERSION:
    verstr = "TLSv1.2";
    break;
#endif
#ifdef TLS1_3_VERSION
  case TLS1_3_VERSION:
    verstr = "TLSv1.3";
    break;
#endif
  case 0:
    break;
  default:
    msnprintf(unknown, sizeof(unknown), "(%x)", ssl_ver);
    verstr = unknown;
    break;
  }

  /* Log progress for interesting records only (like Handshake or Alert), skip
   * all raw record headers (content_type == SSL3_RT_HEADER or ssl_ver == 0).
   * For TLS 1.3, skip notification of the decrypted inner Content-Type.
   */
  if(ssl_ver
#ifdef SSL3_RT_INNER_CONTENT_TYPE
     && content_type != SSL3_RT_INNER_CONTENT_TYPE
#endif
    ) {
    const char *msg_name, *tls_rt_name;
    char ssl_buf[1024];
    int msg_type, txt_len;

    /* the info given when the version is zero is not that useful for us */

    ssl_ver >>= 8; /* check the upper 8 bits only below */

    /* SSLv2 doesn't seem to have TLS record-type headers, so OpenSSL
     * always pass-up content-type as 0. But the interesting message-type
     * is at 'buf[0]'.
     */
    if(ssl_ver == SSL3_VERSION_MAJOR && content_type)
      tls_rt_name = tls_rt_type(content_type);
    else
      tls_rt_name = "";

    if(content_type == SSL3_RT_CHANGE_CIPHER_SPEC) {
      msg_type = *(char *)buf;
      msg_name = "Change cipher spec";
    }
    else if(content_type == SSL3_RT_ALERT) {
      msg_type = (((char *)buf)[0] << 8) + ((char *)buf)[1];
      msg_name = SSL_alert_desc_string_long(msg_type);
    }
    else {
      msg_type = *(char *)buf;
      msg_name = ssl_msg_type(ssl_ver, msg_type);
    }

    txt_len = msnprintf(ssl_buf, sizeof(ssl_buf), "%s (%s), %s, %s (%d):\n",
                        verstr, direction?"OUT":"IN",
                        tls_rt_name, msg_name, msg_type);
    if(0 <= txt_len && (unsigned)txt_len < sizeof(ssl_buf)) {
      Curl_debug(data, CURLINFO_TEXT, ssl_buf, (size_t)txt_len);
    }
  }

  Curl_debug(data, (direction == 1) ? CURLINFO_SSL_DATA_OUT :
             CURLINFO_SSL_DATA_IN, (char *)buf, len);
  (void) ssl;
}